

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_41d9f7e::DumpVisitor::onValue(DumpVisitor *this,int64_t S,bool LEB)

{
  raw_ostream *this_00;
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  byte *in_RCX;
  undefined7 in_register_00000011;
  void *__buf;
  void *extraout_RDX;
  ulong uVar4;
  bool bVar5;
  ulong local_28;
  
  __buf = (void *)CONCAT71(in_register_00000011,LEB);
  this_00 = this->OS;
  if ((int)__buf == 0) {
    local_28 = (ulong)S >> 0x38 | (S & 0xff000000000000U) >> 0x28 | (S & 0xff0000000000U) >> 0x18 |
               (S & 0xff00000000U) >> 8 | (S & 0xff000000U) << 8 | (S & 0xff0000U) << 0x18 |
               (S & 0xff00U) << 0x28 | S << 0x38;
    if (((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
        IsLittleEndian != false) {
      local_28 = S;
    }
    llvm::raw_ostream::write(this_00,(int)&local_28,&DAT_00000008,(size_t)in_RCX);
  }
  else {
    do {
      uVar4 = S >> 7;
      bVar3 = 0;
      bVar5 = 0x3f < (ulong)S;
      if (bVar5) {
        bVar3 = ((S & 0x40U) == 0 || uVar4 != 0xffffffffffffffff) << 7;
      }
      uVar2 = S & 0x40;
      bVar3 = (byte)S & 0x7f | bVar3;
      pbVar1 = (byte *)this_00->OutBufCur;
      if (pbVar1 < this_00->OutBufEnd) {
        in_RCX = pbVar1 + 1;
        this_00->OutBufCur = (char *)in_RCX;
        *pbVar1 = bVar3;
      }
      else {
        llvm::raw_ostream::write(this_00,(uint)bVar3,__buf,(size_t)in_RCX);
        __buf = extraout_RDX;
      }
      S = uVar4;
    } while (bVar5 && (uVar2 == 0 || uVar4 != 0xffffffffffffffff));
  }
  return;
}

Assistant:

void onValue(const int64_t S, const bool LEB = false) override {
    if (LEB)
      encodeSLEB128(S, OS);
    else
      writeInteger(S, OS, DebugInfo.IsLittleEndian);
  }